

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall
testing::internal::TypedExpectation<void_(SDL_Surface_*)>::Matches
          (TypedExpectation<void_(SDL_Surface_*)> *this,ArgumentTuple *args)

{
  bool bVar1;
  MatchResultListener local_28;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_003183f8;
  bVar1 = MatcherBase<SDL_Surface_*>::MatchAndExplain
                    ((MatcherBase<SDL_Surface_*> *)&this->matchers_,(SDL_Surface **)args,&local_28);
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_003183f8;
    bVar1 = MatcherBase<const_std::tuple<SDL_Surface_*>_&>::MatchAndExplain
                      (&(this->extra_matcher_).super_MatcherBase<const_std::tuple<SDL_Surface_*>_&>,
                       args,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }